

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::acquireFboAttachmentReference(ReferenceContext *this,Attachment *attachment)

{
  deBool dVar1;
  TestError *pTVar2;
  Texture *object;
  Renderbuffer *object_00;
  Renderbuffer *rbo;
  Texture *texture;
  Attachment *attachment_local;
  ReferenceContext *this_local;
  
  if (attachment->type == ATTACHMENTTYPE_RENDERBUFFER) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (attachment->name == 0)) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,(char *)0x0,"attachment.name != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0x78a);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    object_00 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                          (&this->m_renderbuffers,attachment->name);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (object_00 == (Renderbuffer *)0x0)) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,(char *)0x0,"rbo",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0x78c);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    rc::ObjectManager<sglr::rc::Renderbuffer>::acquireReference(&this->m_renderbuffers,object_00);
  }
  else if (attachment->type == ATTACHMENTTYPE_TEXTURE) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (attachment->name == 0)) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,(char *)0x0,"attachment.name != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0x781);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    object = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,attachment->name);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (object == (Texture *)0x0)) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,(char *)0x0,"texture",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0x783);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    rc::ObjectManager<sglr::rc::Texture>::acquireReference(&this->m_textures,object);
  }
  return;
}

Assistant:

void ReferenceContext::acquireFboAttachmentReference (const Framebuffer::Attachment& attachment)
{
	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			TCU_CHECK(attachment.name != 0);
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);
			m_textures.acquireReference(texture);
			break;
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			TCU_CHECK(attachment.name != 0);
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);
			m_renderbuffers.acquireReference(rbo);
			break;
		}

		default:
			break; // Silently ignore
	}
}